

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

void __thiscall Datatype::printRaw(Datatype *this,ostream *s)

{
  ostream *this_00;
  
  if ((this->name)._M_string_length != 0) {
    std::operator<<(s,(string *)&this->name);
    return;
  }
  this_00 = std::operator<<(s,"unkbyte");
  *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) =
       *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ostream::operator<<(this_00,this->size);
  return;
}

Assistant:

void Datatype::printRaw(ostream &s) const

{
  if (name.size()>0)
    s << name;
  else
    s << "unkbyte" << dec << size;
}